

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVR3File.cpp
# Opt level: O0

void __thiscall BVR3File::BVR3File(BVR3File *this,vector<char,_std::allocator<char>_> *buf)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  reference pvVar7;
  pointer ppVar8;
  size_type sVar9;
  vector<char,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  int segment_distance_second;
  int segment_distance_first;
  int start_point_distance;
  bool match_found;
  iterator it;
  BRDPoint end_point;
  BRDPoint start_point;
  value_type first_outline_segment;
  double y_1;
  double x_1;
  pair<BRDPoint,_BRDPoint> outline_segment;
  char *pold_1;
  double y;
  double x;
  BRDPoint point;
  char *pold;
  double origin_y;
  double origin_x;
  char *side_1;
  char *mount;
  char *side;
  char *s;
  char *p;
  char *line;
  iterator __end1;
  iterator __begin1;
  vector<char_*,_std::allocator<char_*>_> *__range1;
  vector<char_*,_std::allocator<char_*>_> lines;
  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
  outline_segments;
  BRDPin pin;
  BRDPart part;
  BRDPin blank_pin;
  BRDPart blank_part;
  char *arena_end;
  char *arena;
  size_t file_buf_size;
  char *saved_locale;
  size_type buffer_size;
  BRDPart *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  const_iterator in_stack_fffffffffffff928;
  BRDPart *in_stack_fffffffffffff930;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff938;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff940;
  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  undefined8 in_stack_fffffffffffff968;
  undefined5 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff975;
  undefined1 in_stack_fffffffffffff976;
  byte bVar10;
  undefined1 in_stack_fffffffffffff977;
  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_> local_600;
  _List_node_base *local_5f8;
  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_> local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  BRDPoint *local_5d8;
  _List_node_base *local_5d0;
  _List_node_base *local_5c8;
  _List_node_base *local_5c0;
  _List_node_base *local_5b8;
  _List_node_base *local_5b0;
  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_> local_5a8;
  _List_node_base *local_5a0;
  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_> local_598;
  _Self local_590;
  byte local_581;
  _Self local_580;
  BRDPoint local_578;
  BRDPoint local_570;
  BRDPoint local_568;
  BRDPoint BStack_560;
  double local_558;
  double local_550;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  byte *local_538;
  double local_530;
  double local_528;
  BRDPoint local_520;
  byte *local_518;
  byte **local_510;
  undefined1 *local_508;
  long *local_500;
  undefined1 **local_4f8;
  double local_4f0;
  double local_4e8;
  byte **local_4e0;
  undefined1 *local_4d8;
  long *local_4d0;
  undefined1 **local_4c8;
  char *local_4c0;
  byte **local_4b8;
  undefined1 *local_4b0;
  long *local_4a8;
  undefined1 **local_4a0;
  byte **local_498;
  undefined1 *local_490;
  long *local_488;
  undefined1 **local_480;
  byte **local_478;
  undefined1 *local_470;
  long *local_468;
  undefined1 **local_460;
  char *local_458;
  byte **local_450;
  undefined1 *local_448;
  long *local_440;
  undefined1 **local_438;
  char *local_430;
  byte **local_428;
  undefined1 *local_420;
  long *local_418;
  undefined1 **local_410;
  undefined1 local_408 [8];
  byte *local_400;
  byte *local_3f8;
  char **local_3f0;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_3e8;
  undefined1 *local_3e0;
  undefined1 local_3d8 [24];
  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_> local_3c0;
  int local_3a8;
  int local_3a4;
  int local_39c;
  undefined4 local_398;
  char *local_390;
  double local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined4 local_348;
  uint local_344;
  undefined4 local_340;
  undefined1 local_328 [128];
  undefined1 *local_2a8;
  long local_2a0;
  char *local_298;
  char *local_290;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  size_t local_160;
  string local_158 [55];
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  ulong local_18;
  vector<char,_std::allocator<char>_> *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
  local_10 = in_RSI;
  BRDFileBase::BRDFileBase
            ((BRDFileBase *)
             CONCAT17(in_stack_fffffffffffff977,
                      CONCAT16(in_stack_fffffffffffff976,
                               CONCAT15(in_stack_fffffffffffff975,in_stack_fffffffffffff970))));
  *in_RDI = &PTR__BVR3File_00302f68;
  local_18 = std::vector<char,_std::allocator<char>_>::size(local_10);
  local_20 = setlocale(1,"C");
  if (local_18 < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
               (char *)in_stack_fffffffffffff958,(allocator<char> *)in_stack_fffffffffffff950);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::__cxx11::to_string(iVar3);
    std::operator+(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff928._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
    std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"%s",uVar4);
  }
  else {
    local_160 = (local_18 + 1) * 3;
    pvVar5 = calloc(1,local_160);
    in_RDI[0x17] = pvVar5;
    if (in_RDI[0x17] == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                 (char *)in_stack_fffffffffffff958,(allocator<char> *)in_stack_fffffffffffff950);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::to_string(iVar3);
      std::operator+(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff928._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::string::operator=((string *)(in_RDI + 0x13),local_180);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator(&local_261);
      uVar4 = std::__cxx11::string::c_str();
      SDL_LogError(1,"%s",uVar4);
    }
    else {
      local_290 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff918);
      local_298 = (char *)std::vector<char,_std::allocator<char>_>::end
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff918);
      std::copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                 (char *)in_stack_fffffffffffff930);
      *(undefined1 *)(in_RDI[0x17] + local_18) = 0;
      local_2a0 = local_18 + 1 + in_RDI[0x17];
      local_2a8 = (undefined1 *)(in_RDI[0x17] + -1 + local_160);
      *local_2a8 = 0;
      BRDPart::BRDPart(in_stack_fffffffffffff930);
      BRDPin::BRDPin((BRDPin *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      BRDPart::BRDPart(in_stack_fffffffffffff930);
      BRDPin::BRDPin((BRDPin *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
      std::__cxx11::
      list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>::list
                ((list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                  *)0x1759e6);
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)0x1759fb);
      stringfile(in_stack_fffffffffffff940._M_current,
                 (vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff938._M_current);
      local_3e0 = local_3d8;
      local_3e8._M_current =
           (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff918)
      ;
      local_3f0 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                     ((vector<char_*,_std::allocator<char_*>_> *)
                                      in_stack_fffffffffffff918);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
                                (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                 *)in_stack_fffffffffffff918), bVar2) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                  operator*(&local_3e8);
        local_3f8 = (byte *)*ppcVar6;
        while (iVar3 = isspace((uint)*local_3f8), iVar3 != 0) {
          local_3f8 = local_3f8 + 1;
        }
        if (*local_3f8 != 0) {
          local_400 = local_3f8;
          iVar3 = strncmp((char *)local_3f8,"PART_NAME ",10);
          if (iVar3 == 0) {
            local_400 = local_400 + 10;
            local_428 = &local_400;
            local_420 = local_408;
            local_418 = &local_2a0;
            local_410 = &local_2a8;
            local_370 = BVR3File::anon_class_32_4_fa413470::operator()
                                  ((anon_class_32_4_fa413470 *)
                                   CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
          }
          else {
            iVar3 = strncmp((char *)local_3f8,"PART_SIDE ",10);
            if (iVar3 == 0) {
              local_400 = local_400 + 10;
              local_450 = &local_400;
              local_448 = local_408;
              local_440 = &local_2a0;
              local_438 = &local_2a8;
              local_430 = BVR3File::anon_class_32_4_fa413470::operator()
                                    ((anon_class_32_4_fa413470 *)
                                     CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920));
              iVar3 = strcmp(local_430,"T");
              if (iVar3 == 0) {
                local_348 = 2;
              }
              else {
                iVar3 = strcmp(local_430,"B");
                if (iVar3 == 0) {
                  local_348 = 1;
                }
                else {
                  iVar3 = strcmp(local_430,"O");
                  if (iVar3 == 0) {
                    local_348 = 0;
                  }
                }
              }
            }
            else {
              iVar3 = strncmp((char *)local_3f8,"PART_ORIGIN ",0xc);
              if (iVar3 != 0) {
                iVar3 = strncmp((char *)local_3f8,"PART_MOUNT ",0xb);
                if (iVar3 == 0) {
                  local_400 = local_400 + 0xb;
                  local_478 = &local_400;
                  local_470 = local_408;
                  local_468 = &local_2a0;
                  local_460 = &local_2a8;
                  local_458 = BVR3File::anon_class_32_4_fa413470::operator()
                                        ((anon_class_32_4_fa413470 *)
                                         CONCAT17(in_stack_fffffffffffff927,
                                                  in_stack_fffffffffffff920));
                  iVar3 = strcmp(local_458,"SMD");
                  local_344 = (uint)(iVar3 != 0);
                }
                else {
                  iVar3 = strncmp((char *)local_3f8,"PART_OUTLINE_RELATIVE ",0x16);
                  if ((iVar3 != 0) && (iVar3 = strncmp((char *)local_3f8,"PIN_ID ",7), iVar3 != 0))
                  {
                    iVar3 = strncmp((char *)local_3f8,"PIN_NUMBER ",0xb);
                    if (iVar3 == 0) {
                      local_400 = local_400 + 0xb;
                      local_498 = &local_400;
                      local_490 = local_408;
                      local_488 = &local_2a0;
                      local_480 = &local_2a8;
                      local_380 = BVR3File::anon_class_32_4_fa413470::operator()
                                            ((anon_class_32_4_fa413470 *)
                                             CONCAT17(in_stack_fffffffffffff927,
                                                      in_stack_fffffffffffff920));
                    }
                    else {
                      iVar3 = strncmp((char *)local_3f8,"PIN_NAME ",9);
                      if (iVar3 == 0) {
                        local_400 = local_400 + 9;
                        local_4b8 = &local_400;
                        local_4b0 = local_408;
                        local_4a8 = &local_2a0;
                        local_4a0 = &local_2a8;
                        local_378 = BVR3File::anon_class_32_4_fa413470::operator()
                                              ((anon_class_32_4_fa413470 *)
                                               CONCAT17(in_stack_fffffffffffff927,
                                                        in_stack_fffffffffffff920));
                      }
                      else {
                        iVar3 = strncmp((char *)local_3f8,"PIN_SIDE ",9);
                        if (iVar3 == 0) {
                          local_400 = local_400 + 9;
                          local_4e0 = &local_400;
                          local_4d8 = local_408;
                          local_4d0 = &local_2a0;
                          local_4c8 = &local_2a8;
                          local_4c0 = BVR3File::anon_class_32_4_fa413470::operator()
                                                ((anon_class_32_4_fa413470 *)
                                                 CONCAT17(in_stack_fffffffffffff927,
                                                          in_stack_fffffffffffff920));
                          iVar3 = strcmp(local_4c0,"T");
                          if (iVar3 == 0) {
                            local_398 = 2;
                          }
                          else {
                            iVar3 = strcmp(local_4c0,"B");
                            if (iVar3 == 0) {
                              local_398 = 1;
                            }
                            else {
                              iVar3 = strcmp(local_4c0,"O");
                              if (iVar3 == 0) {
                                local_398 = 0;
                              }
                            }
                          }
                        }
                        else {
                          iVar3 = strncmp((char *)local_3f8,"PIN_ORIGIN ",0xb);
                          if (iVar3 == 0) {
                            local_400 = local_400 + 0xb;
                            local_4e8 = strtod((char *)local_400,(char **)&local_400);
                            dVar1 = trunc(local_4e8);
                            local_3a8 = (int)dVar1;
                            local_4f0 = strtod((char *)local_400,(char **)&local_400);
                            dVar1 = trunc(local_4f0);
                            local_3a4 = (int)dVar1;
                          }
                          else {
                            iVar3 = strncmp((char *)local_3f8,"PIN_RADIUS ",0xb);
                            if (iVar3 == 0) {
                              local_400 = local_400 + 0xb;
                              local_388 = strtod((char *)local_400,(char **)&local_400);
                            }
                            else {
                              iVar3 = strncmp((char *)local_3f8,"PIN_NET ",8);
                              if (iVar3 == 0) {
                                local_400 = local_400 + 8;
                                local_510 = &local_400;
                                local_508 = local_408;
                                local_500 = &local_2a0;
                                local_4f8 = &local_2a8;
                                local_390 = BVR3File::anon_class_32_4_fa413470::operator()
                                                      ((anon_class_32_4_fa413470 *)
                                                       CONCAT17(in_stack_fffffffffffff927,
                                                                in_stack_fffffffffffff920));
                              }
                              else {
                                iVar3 = strncmp((char *)local_3f8,"PIN_TYPE ",9);
                                if (((iVar3 != 0) &&
                                    (iVar3 = strncmp((char *)local_3f8,"PIN_COMMENT ",0xc),
                                    iVar3 != 0)) &&
                                   (iVar3 = strncmp((char *)local_3f8,"PIN_OUTLINE_RELATIVE ",0x15),
                                   iVar3 != 0)) {
                                  iVar3 = strcmp((char *)local_3f8,"PIN_END");
                                  if (iVar3 == 0) {
                                    sVar9 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                                                      ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                                       (in_RDI + 9));
                                    local_39c = (int)sVar9 + 1;
                                    std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                              ((vector<BRDPin,_std::allocator<BRDPin>_> *)
                                               in_stack_fffffffffffff930,
                                               (value_type *)in_stack_fffffffffffff928._M_node);
                                    memcpy(&local_3a8,local_328,0x38);
                                  }
                                  else {
                                    iVar3 = strcmp((char *)local_3f8,"PART_END");
                                    if (iVar3 == 0) {
                                      sVar9 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                                                        ((vector<BRDPin,_std::allocator<BRDPin>_> *)
                                                         (in_RDI + 0xc));
                                      local_340 = (undefined4)sVar9;
                                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                                ((vector<BRDPart,_std::allocator<BRDPart>_> *)
                                                 in_stack_fffffffffffff930,
                                                 (value_type *)in_stack_fffffffffffff928._M_node);
                                      BRDPart::operator=((BRDPart *)
                                                         CONCAT17(in_stack_fffffffffffff927,
                                                                  in_stack_fffffffffffff920),
                                                         in_stack_fffffffffffff918);
                                    }
                                    else {
                                      iVar3 = strncmp((char *)local_3f8,"OUTLINE_POINTS ",0xf);
                                      if (iVar3 == 0) {
                                        local_400 = local_400 + 0xf;
                                        while (*local_400 != 0) {
                                          local_518 = local_400;
                                          BRDPoint::BRDPoint(&local_520);
                                          local_528 = strtod((char *)local_400,(char **)&local_400);
                                          dVar1 = trunc(local_528);
                                          local_520.x = (int)dVar1;
                                          local_530 = strtod((char *)local_400,(char **)&local_400);
                                          dVar1 = trunc(local_530);
                                          local_520.y = (int)dVar1;
                                          if (local_518 == local_400) break;
                                          std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                          push_back((vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                    in_stack_fffffffffffff930,
                                                    (value_type *)in_stack_fffffffffffff928._M_node)
                                          ;
                                        }
                                      }
                                      else {
                                        iVar3 = strncmp((char *)local_3f8,"OUTLINE_SEGMENTED ",0x12)
                                        ;
                                        if (iVar3 == 0) {
                                          local_400 = local_400 + 0x12;
                                          while (*local_400 != 0) {
                                            local_538 = local_400;
                                            std::pair<BRDPoint,_BRDPoint>::
                                            pair<BRDPoint,_BRDPoint,_true>
                                                      ((pair<BRDPoint,_BRDPoint> *)
                                                       CONCAT17(in_stack_fffffffffffff927,
                                                                in_stack_fffffffffffff920));
                                            local_550 = strtod((char *)local_400,(char **)&local_400
                                                              );
                                            dVar1 = trunc(local_550);
                                            local_548 = (int)dVar1;
                                            local_558 = strtod((char *)local_400,(char **)&local_400
                                                              );
                                            dVar1 = trunc(local_558);
                                            local_544 = (int)dVar1;
                                            local_550 = strtod((char *)local_400,(char **)&local_400
                                                              );
                                            dVar1 = trunc(local_550);
                                            local_540 = (int)dVar1;
                                            local_558 = strtod((char *)local_400,(char **)&local_400
                                                              );
                                            dVar1 = trunc(local_558);
                                            local_53c = (int)dVar1;
                                            if (local_538 == local_400) break;
                                            std::__cxx11::
                                            list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                            ::push_back((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                          }
                                          bVar2 = std::__cxx11::
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::empty(&local_3c0);
                                          if (!bVar2) {
                                            pvVar7 = std::__cxx11::
                                                                                                          
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::front((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920));
                                            local_568 = pvVar7->first;
                                            BStack_560 = pvVar7->second;
                                            std::__cxx11::
                                            list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                            ::pop_front((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920));
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back((vector<BRDPoint,_std::allocator<BRDPoint>_> *
                                                      )in_stack_fffffffffffff930,
                                                      (value_type *)
                                                      in_stack_fffffffffffff928._M_node);
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back((vector<BRDPoint,_std::allocator<BRDPoint>_> *
                                                      )in_stack_fffffffffffff930,
                                                      (value_type *)
                                                      in_stack_fffffffffffff928._M_node);
                                            local_570 = local_568;
                                            local_578 = BStack_560;
LAB_00176653:
                                            do {
                                              bVar2 = BRDPoint::operator!=(&local_570,&local_578);
                                              bVar10 = 0;
                                              if (bVar2) {
                                                bVar2 = std::__cxx11::
                                                                                                                
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::empty(&local_3c0);
                                                bVar10 = bVar2 ^ 0xff;
                                              }
                                              if ((bVar10 & 1) == 0) goto LAB_00176b56;
                                              local_580._M_node =
                                                   (_List_node_base *)
                                                   std::__cxx11::
                                                                                                      
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::begin((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)in_stack_fffffffffffff918);
                                              local_581 = 0;
                                              while( true ) {
                                                local_590._M_node =
                                                     (_List_node_base *)
                                                     std::__cxx11::
                                                                                                          
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::end((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)in_stack_fffffffffffff918);
                                                bVar2 = std::operator!=(&local_580,&local_590);
                                                if (!bVar2) break;
                                                ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x1766fc);
                                                bVar2 = BRDPoint::operator==
                                                                  (&local_578,&ppVar8->first);
                                                if (bVar2) {
                                                  std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x17673d);
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                  ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x17675d);
                                                  local_578 = ppVar8->second;
                                                  std::
                                                  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                  ::_List_const_iterator(&local_598,&local_580);
                                                  local_5a0 = (_List_node_base *)
                                                              std::__cxx11::
                                                                                                                            
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920),
                                                  in_stack_fffffffffffff928);
                                                  local_581 = 1;
                                                  break;
                                                }
                                                ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x1767b5);
                                                bVar2 = BRDPoint::operator==
                                                                  (&local_578,&ppVar8->second);
                                                if (bVar2) {
                                                  std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x1767fa);
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                  ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176816);
                                                  local_578 = ppVar8->first;
                                                  std::
                                                  _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                  ::_List_const_iterator(&local_5a8,&local_580);
                                                  local_5b0 = (_List_node_base *)
                                                              std::__cxx11::
                                                                                                                            
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920),
                                                  in_stack_fffffffffffff928);
                                                  local_581 = 1;
                                                  break;
                                                }
                                                local_5b8 = (_List_node_base *)
                                                            std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator++(&local_580,0);
                                              }
                                            } while ((local_581 & 1) != 0);
                                            __first._M_node = (_List_node_base *)&local_3c0;
                                            local_5c8 = (_List_node_base *)
                                                        std::__cxx11::
                                                                                                                
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::begin((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)in_stack_fffffffffffff918);
                                            local_5d0 = (_List_node_base *)
                                                        std::__cxx11::
                                                                                                                
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::end((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)in_stack_fffffffffffff918);
                                            local_5d8 = &local_578;
                                            local_5c0 = (_List_node_base *)
                                                        std::
                                                  min_element<std::_List_iterator<std::pair<BRDPoint,BRDPoint>>,BVR3File::BVR3File(std::vector<char,std::allocator<char>>&)::__0>
                                                            (__first,(
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>)
                                                  in_stack_fffffffffffff940._M_current,
                                                  (anon_class_8_1_89c377cc_for__M_comp)
                                                  in_stack_fffffffffffff938._M_current);
                                            local_580._M_node = local_5c0;
                                            local_5dc = manhattan_distance(&local_578,&local_570);
                                            ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176930);
                                            local_5e0 = manhattan_distance(&local_578,&ppVar8->first
                                                                          );
                                            ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176954);
                                            local_5e4 = manhattan_distance(&local_578,
                                                                           &ppVar8->second);
                                            if ((local_5e0 < local_5dc) || (local_5e4 < local_5dc))
                                            {
                                              if (local_5e4 < local_5e0) {
                                                in_stack_fffffffffffff930 = (BRDPart *)(in_RDI + 3);
                                                std::_List_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176a9f);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                in_stack_fffffffffffff928._M_node =
                                                     (_List_node_base *)(in_RDI + 3);
                                                std::_List_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176ad0);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176aec);
                                                local_578 = ppVar8->first;
                                                std::
                                                _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::_List_const_iterator(&local_600,&local_580);
                                                std::__cxx11::
                                                list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920),
                                                  in_stack_fffffffffffff928);
                                              }
                                              else {
                                                in_stack_fffffffffffff940._M_current =
                                                     (char *)(in_RDI + 3);
                                                std::_List_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x1769f1);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                in_stack_fffffffffffff938._M_current =
                                                     (char *)(in_RDI + 3);
                                                std::_List_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176a1e);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  in_stack_fffffffffffff930,
                                                  (value_type *)in_stack_fffffffffffff928._M_node);
                                                ppVar8 = std::
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>::
                                                  operator->((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> *)
                                                  0x176a3e);
                                                local_578 = ppVar8->second;
                                                std::
                                                _List_const_iterator<std::pair<BRDPoint,_BRDPoint>_>
                                                ::_List_const_iterator(&local_5f0,&local_580);
                                                local_5f8 = (_List_node_base *)
                                                            std::__cxx11::
                                                                                                                        
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff927,
                                                             in_stack_fffffffffffff920),
                                                  in_stack_fffffffffffff928);
                                              }
                                              goto LAB_00176653;
                                            }
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back((vector<BRDPoint,_std::allocator<BRDPoint>_> *
                                                      )in_stack_fffffffffffff930,
                                                      (value_type *)
                                                      in_stack_fffffffffffff928._M_node);
                                            local_578 = local_570;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00176b56:
        __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
        operator++(&local_3e8);
      }
      sVar9 = std::vector<BRDPart,_std::allocator<BRDPart>_>::size
                        ((vector<BRDPart,_std::allocator<BRDPart>_> *)(in_RDI + 9));
      *(int *)((long)in_RDI + 0xc) = (int)sVar9;
      sVar9 = std::vector<BRDPin,_std::allocator<BRDPin>_>::size
                        ((vector<BRDPin,_std::allocator<BRDPin>_> *)(in_RDI + 0xc));
      *(int *)(in_RDI + 2) = (int)sVar9;
      sVar9 = std::vector<BRDPoint,_std::allocator<BRDPoint>_>::size
                        ((vector<BRDPoint,_std::allocator<BRDPoint>_> *)(in_RDI + 3));
      *(int *)(in_RDI + 1) = (int)sVar9;
      sVar9 = std::vector<BRDNail,_std::allocator<BRDNail>_>::size
                        ((vector<BRDNail,_std::allocator<BRDNail>_> *)(in_RDI + 0xf));
      *(int *)((long)in_RDI + 0x14) = (int)sVar9;
      setlocale(1,local_20);
      bVar2 = true;
      if (*(int *)((long)in_RDI + 0xc) == 0) {
        bVar2 = *(int *)(in_RDI + 1) != 0;
      }
      *(bool *)(in_RDI + 0x12) = bVar2;
      std::vector<char_*,_std::allocator<char_*>_>::~vector
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffff930);
      std::__cxx11::
      list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>::~list
                ((list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                  *)0x176c2b);
      BRDPart::~BRDPart((BRDPart *)0x176c38);
      BRDPart::~BRDPart((BRDPart *)0x176c45);
    }
  }
  return;
}

Assistant:

BVR3File::BVR3File(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	BRDPart blank_part;
	BRDPin blank_pin;
	BRDPart part;
	BRDPin pin;
	std::list<std::pair<BRDPoint, BRDPoint>> outline_segments;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (!strncmp(line, "PART_NAME ", 10)) {
			p += 10;
			part.name = READ_STR();
		} else if (!strncmp(line, "PART_SIDE ", 10)) {
			p += 10;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				part.mounting_side = BRDPartMountingSide::Top;
			else if (!strcmp(side, "B"))
				part.mounting_side = BRDPartMountingSide::Bottom;
			else if (!strcmp(side, "O"))
				part.mounting_side = BRDPartMountingSide::Both;
		} else if (!strncmp(line, "PART_ORIGIN ", 12)) {
			// Value ignored, used as reference point for relative pin placements, not currently supported
		} else if (!strncmp(line, "PART_MOUNT ", 11)) {
			p += 11;
			char *mount = READ_STR();
			if (!strcmp(mount, "SMD"))
				part.part_type = BRDPartType::SMD;
			else
				part.part_type = BRDPartType::ThroughHole;
		} else if (!strncmp(line, "PART_OUTLINE_RELATIVE ", 22)) {
			// Value ignored, custom outline for parts not yet supported
		} else if (!strncmp(line, "PIN_ID ", 7)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_NUMBER ", 11)) {
			p += 11;
			pin.snum = READ_STR();
		} else if (!strncmp(line, "PIN_NAME ", 9)) {
			p += 9;
			pin.name = READ_STR();
		} else if (!strncmp(line, "PIN_SIDE ", 9)) {
			p += 9;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				pin.side = BRDPinSide::Top;
			else if (!strcmp(side, "B"))
				pin.side = BRDPinSide::Bottom;
			else if (!strcmp(side, "O"))
				pin.side = BRDPinSide::Both;
		} else if (!strncmp(line, "PIN_ORIGIN ", 11)) {
			p += 11;
			double origin_x = READ_DOUBLE();
			pin.pos.x = trunc(origin_x);
			double origin_y = READ_DOUBLE();
			pin.pos.y = trunc(origin_y);
		} else if (!strncmp(line, "PIN_RADIUS ", 11)) {
			p += 11;
			pin.radius = READ_DOUBLE();
		} else if (!strncmp(line, "PIN_NET ", 8)) {
			p += 8;
			pin.net = READ_STR();
		} else if (!strncmp(line, "PIN_TYPE ", 9)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_COMMENT ", 12)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_OUTLINE_RELATIVE ", 21)) {
			// Value ignored, custom outline for pins not yet supported
		} else if (!strcmp(line, "PIN_END")) {
			pin.part = parts.size() + 1; // pin is for current part, which will not yet have been added to parts vector
			pins.push_back(pin);
			pin = blank_pin;
		} else if (!strcmp(line, "PART_END")) {
			part.end_of_pins = pins.size();
			parts.push_back(part);
			part = blank_part;
		} else if (!strncmp(line, "OUTLINE_POINTS ", 15)) {
			p += 15;
			while (p[0]) {
				auto pold = p;
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x);
				double y = READ_DOUBLE();
				point.y  = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				format.push_back(point);
			}
		} else if (!strncmp(line, "OUTLINE_SEGMENTED ", 18)) {
			p += 18;
			while (p[0]) {
				auto pold = p;
				std::pair<BRDPoint, BRDPoint> outline_segment;
				double x = READ_DOUBLE();
				outline_segment.first.x  = trunc(x);
				double y = READ_DOUBLE();
				outline_segment.first.y  = trunc(y);
				x = READ_DOUBLE();
				outline_segment.second.x = trunc(x);
				y = READ_DOUBLE();
				outline_segment.second.y = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				outline_segments.push_back(outline_segment);
			}

			if (outline_segments.empty())
				continue;

			// Get first segment and add both points to format
			auto first_outline_segment = outline_segments.front();
			outline_segments.pop_front();
			format.push_back(first_outline_segment.first);
			format.push_back(first_outline_segment.second);

			// Loop through remaining segments picking the best candidate for the next segment
			BRDPoint start_point = first_outline_segment.first;
			BRDPoint end_point = first_outline_segment.second;
			while (start_point != end_point && !outline_segments.empty()) {
				// Loop through segments checking for exact match between points
				auto it = outline_segments.begin();
				bool match_found = false;
				while (it != outline_segments.end()) {
					// If exact match found on either first or second point, add other point to format and remove segment
					if (end_point == it->first) {
						format.push_back(it->second);
						end_point = it->second;
						outline_segments.erase(it);
						match_found = true;
						break;
					} else if (end_point == it->second) {
						format.push_back(it->first);
						end_point = it->first;
						outline_segments.erase(it);
						match_found = true;
						break;
					}
					it++;
				}
				if (match_found)
					continue;

				// Exact match not found, so pick nearest segment instead
				it = std::min_element(
					outline_segments.begin(),
					outline_segments.end(),
					[&end_point](const std::pair<BRDPoint, BRDPoint> &os1, const std::pair<BRDPoint, BRDPoint> &os2) {
						return std::min(manhattan_distance(end_point, os1.first), manhattan_distance(end_point, os1.second))
							< std::min(manhattan_distance(end_point, os2.first), manhattan_distance(end_point, os2.second));
					});

				// Calculate distances for comparison
				auto start_point_distance = manhattan_distance(end_point, start_point);
				auto segment_distance_first = manhattan_distance(end_point, it->first);
				auto segment_distance_second = manhattan_distance(end_point, it->second);

				// If start point is closer than both nearest segment points, format path more likely to be complete
				if (start_point_distance <= segment_distance_first && start_point_distance <= segment_distance_second) {
					format.push_back(start_point);
					end_point = start_point;
					break;
				}

				// Otherwise add points from nearest segment to format with closest point first, then remove segment
				if (segment_distance_first <= segment_distance_second) {
					format.push_back(it->first);
					format.push_back(it->second);
					end_point = it->second;
					outline_segments.erase(it);
				} else {
					format.push_back(it->second);
					format.push_back(it->first);
					end_point = it->first;
					outline_segments.erase(it);
				}
			}
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = num_parts > 0 || num_format > 0;
}